

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,1,0>::accumulateDerivativesImpl<true,false,true>
          (BeagleCPUImpl<float,1,0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  
  uVar2 = *(uint *)(this + 0x14);
  lVar3 = *(long *)(this + 0xf8);
  lVar4 = *(long *)(this + 0xf0);
  lVar5 = *(long *)(this + 0x78);
  auVar8 = ZEXT816(0) << 0x40;
  uVar6 = 0;
  while( true ) {
    if ((~((int)uVar2 >> 0x1f) & uVar2) == uVar6) break;
    fVar9 = *(float *)(lVar3 + uVar6 * 4) / *(float *)(lVar4 + uVar6 * 4);
    outDerivatives[uVar6] = (double)fVar9;
    auVar10._0_8_ = (double)(fVar9 * fVar9);
    auVar10._8_8_ = 0;
    auVar7._0_8_ = (double)auVar8._0_4_;
    auVar7._8_8_ = auVar8._8_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(lVar5 + uVar6 * 8);
    auVar1 = vfmadd231sd_fma(auVar7,auVar10,auVar1);
    uVar6 = uVar6 + 1;
    auVar8._0_4_ = (float)auVar1._0_8_;
    auVar8._4_12_ = auVar1._4_12_;
  }
  *outSumSquaredDerivatives = (double)auVar8._0_4_;
  return;
}

Assistant:

void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesImpl(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    REALTYPE sum = 0.0;
    REALTYPE sumSquared = 0.0;

    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE derivative = grandNumeratorDerivTmp[k] / grandDenominatorDerivTmp[k];
        if (DoDerivatives) {
            outDerivatives[k] = derivative;
        }
        if (DoSum) { // TODO Confirm that these are compile-time
            sum += derivative * gPatternWeights[k];
        }
        if (DoSumSquared) {
            sumSquared += derivative * derivative * gPatternWeights[k];
        }
    }

    if (DoSum) {
        *outSumDerivatives = sum;
    }

    if (DoSumSquared) {
        *outSumSquaredDerivatives = sumSquared;
    }
}